

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdExpandCollectXor_rec(Kit_DsdNtk_t *p,uint iLit,uint *piLitsNew,int *nLitsNew)

{
  int iVar1;
  uint uVar2;
  Kit_DsdObj_t *pKVar3;
  ulong uVar4;
  
  iVar1 = Abc_Lit2Var(iLit);
  pKVar3 = Kit_DsdNtkObj(p,iVar1);
  uVar2 = Abc_Lit2Var(iLit);
  if ((uVar2 < p->nVars) || (((uint)*pKVar3 & 0x1c0) != 0x100)) {
    iVar1 = *nLitsNew;
    *nLitsNew = iVar1 + 1;
    piLitsNew[iVar1] = iLit;
  }
  else {
    iVar1 = Abc_Lit2Var(iLit);
    pKVar3 = Kit_DsdNtkObj(p,iVar1);
    for (uVar4 = 0; uVar4 < (uint)*pKVar3 >> 0x1a; uVar4 = uVar4 + 1) {
      Kit_DsdExpandCollectXor_rec
                (p,(uint)*(ushort *)(&pKVar3[1].field_0x0 + uVar4 * 2),piLitsNew,nLitsNew);
    }
    iVar1 = Abc_LitIsCompl(iLit);
    if (iVar1 != 0) {
      uVar2 = Abc_LitNot(*piLitsNew);
      *piLitsNew = uVar2;
    }
  }
  return;
}

Assistant:

void Kit_DsdExpandCollectXor_rec( Kit_DsdNtk_t * p, unsigned iLit, unsigned * piLitsNew, int * nLitsNew )
{
    Kit_DsdObj_t * pObj;
    unsigned i, iLitFanin;
    // check the end of the supergate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( Abc_Lit2Var(iLit) < p->nVars || pObj->Type != KIT_DSD_XOR )
    {
        piLitsNew[(*nLitsNew)++] = iLit;
        return;
    }
    // iterate through the fanins
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        Kit_DsdExpandCollectXor_rec( p, iLitFanin, piLitsNew, nLitsNew );
    // if the literal was complemented, pass the complemented attribute somewhere
    if ( Abc_LitIsCompl(iLit) )
        piLitsNew[0] = Abc_LitNot( piLitsNew[0] );
}